

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O3

void __thiscall QErrorMessage::done(QErrorMessage *this,int a)

{
  QErrorMessagePrivate *this_00;
  QArrayData *pQVar1;
  bool bVar2;
  QHashDummyValue *args;
  QString *key;
  QHash<QString,QHashDummyValue> *this_01;
  long in_FS_OFFSET;
  QHashDummyValue local_22;
  QHashDummyValue local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QErrorMessagePrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  bVar2 = QAbstractButton::isChecked(&this_00->again->super_QAbstractButton);
  if (!bVar2) {
    if ((this_00->currentType).d.size == 0) {
      if ((this_00->currentMessage).d.size == 0) goto LAB_004dabe6;
      key = &this_00->currentMessage;
      this_01 = (QHash<QString,QHashDummyValue> *)&this_00->doNotShow;
      args = &local_22;
    }
    else {
      key = &this_00->currentType;
      this_01 = (QHash<QString,QHashDummyValue> *)&this_00->doNotShowType;
      args = &local_21;
    }
    QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>(this_01,key,args);
  }
LAB_004dabe6:
  if ((this_00->currentMessage).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this_00->currentMessage).d.d)->super_QArrayData;
    (this_00->currentMessage).d.d = (Data *)0x0;
    (this_00->currentMessage).d.ptr = (char16_t *)0x0;
    (this_00->currentMessage).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if ((this_00->currentType).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this_00->currentType).d.d)->super_QArrayData;
    (this_00->currentType).d.d = (Data *)0x0;
    (this_00->currentType).d.ptr = (char16_t *)0x0;
    (this_00->currentType).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  QDialog::done(&this->super_QDialog,a);
  bVar2 = QErrorMessagePrivate::nextPending(this_00);
  if (bVar2) {
    QWidget::show((QWidget *)this);
  }
  else if ((qtMessageHandler == this) && (metFatal == true)) {
    exit(1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QErrorMessage::done(int a)
{
    Q_D(QErrorMessage);
    if (!d->again->isChecked()) {
        if (d->currentType.isEmpty()) {
            if (!d->currentMessage.isEmpty())
                d->doNotShow.insert(d->currentMessage);
        } else {
            d->doNotShowType.insert(d->currentType);
        }
    }
    d->currentMessage.clear();
    d->currentType.clear();

    QDialog::done(a);

    if (d->nextPending()) {
        show();
    } else {
        if (this == qtMessageHandler && metFatal)
            exit(1);
    }
}